

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::mark_as_workgroup_struct(CompilerMSL *this,SPIRType *type)

{
  uint32_t uVar1;
  size_t sVar2;
  bool bVar3;
  SPIRType *pSVar4;
  uint32_t mbr_idx;
  ulong uVar5;
  
  while (uVar1 = (type->parent_type).id, uVar1 != 0) {
    type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar1);
  }
  if (type->basetype == Struct) {
    bVar3 = Compiler::has_extended_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,
                       SPIRVCrossDecorationWorkgroupStruct);
    if (!bVar3) {
      Compiler::set_extended_decoration
                ((Compiler *)this,(type->super_IVariant).self.id,SPIRVCrossDecorationWorkgroupStruct
                 ,0);
      sVar2 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size;
      for (uVar5 = 0; (uint)sVar2 != uVar5; uVar5 = uVar5 + 1) {
        pSVar4 = Compiler::get<spirv_cross::SPIRType>
                           ((Compiler *)this,
                            (type->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                            [uVar5].id);
        mark_as_workgroup_struct(this,pSVar4);
        uVar1 = (pSVar4->type_alias).id;
        if (uVar1 != 0) {
          pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar1);
          mark_as_workgroup_struct(this,pSVar4);
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::mark_as_workgroup_struct(SPIRType &type)
{
	// If this is not the base type (eg. it's a pointer or array), tunnel down
	if (type.parent_type)
	{
		mark_as_workgroup_struct(get<SPIRType>(type.parent_type));
		return;
	}

	// Handle possible recursion when a struct contains a pointer to its own type nested somewhere.
	if (type.basetype == SPIRType::Struct && !has_extended_decoration(type.self, SPIRVCrossDecorationWorkgroupStruct))
	{
		set_extended_decoration(type.self, SPIRVCrossDecorationWorkgroupStruct);

		// Recurse
		uint32_t mbr_cnt = uint32_t(type.member_types.size());
		for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
		{
			uint32_t mbr_type_id = type.member_types[mbr_idx];
			auto &mbr_type = get<SPIRType>(mbr_type_id);
			mark_as_workgroup_struct(mbr_type);
			if (mbr_type.type_alias)
			{
				auto &mbr_type_alias = get<SPIRType>(mbr_type.type_alias);
				mark_as_workgroup_struct(mbr_type_alias);
			}
		}
	}
}